

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

_outconnect * obj_connect(t_object *source,int outno,t_object *sink,int inno)

{
  _outlet *x;
  _outconnect *p_Var1;
  _outconnect *p_Var2;
  _outconnect *p_Var3;
  _outconnect *p_Var4;
  _outlet **pp_Var5;
  _inlet **pp_Var6;
  bool bVar7;
  
  pp_Var5 = &source->te_outlet;
  while( true ) {
    x = *pp_Var5;
    bVar7 = outno == 0;
    outno = outno + -1;
    if ((x == (_outlet *)0x0) || (bVar7)) break;
    pp_Var5 = &x->o_next;
  }
  if (x == (_outlet *)0x0) {
LAB_00168472:
    p_Var3 = (_outconnect *)0x0;
  }
  else {
    if (((sink->te_g).g_pd)->c_firstin == '\0') {
LAB_00168422:
      pp_Var6 = &sink->te_inlet;
      while( true ) {
        sink = (t_object *)*pp_Var6;
        bVar7 = inno == 0;
        inno = inno + -1;
        if ((sink == (t_object *)0x0) || (bVar7)) break;
        pp_Var6 = (_inlet **)&((t_pd)sink)->c_helpname;
      }
      if (sink == (t_object *)0x0) goto LAB_00168472;
    }
    else if (inno != 0) {
      inno = inno + -1;
      goto LAB_00168422;
    }
    p_Var2 = (_outconnect *)outlet_getconnectionpointer(x);
    p_Var3 = (_outconnect *)getbytes(0x10);
    p_Var3->oc_next = (_outconnect *)0x0;
    p_Var3->oc_to = (t_pd *)sink;
    p_Var1 = p_Var2->oc_next;
    while (p_Var4 = p_Var1, p_Var4 != (_outconnect *)0x0) {
      p_Var2 = p_Var4;
      p_Var1 = p_Var4->oc_next;
    }
    p_Var2->oc_next = p_Var3;
    if (x->o_sym == &s_signal) {
      canvas_update_dsp();
    }
  }
  return p_Var3;
}

Assistant:

t_outconnect *obj_connect(t_object *source, int outno,
    t_object *sink, int inno)
{
    t_inlet *i;
    t_outlet *o;
    t_pd *to;
    t_outconnect *oc, *oc2, **ochead;

    for (o = source->ob_outlet; o && outno; o = o->o_next, outno--) ;
    if (!o) return (0);

    if (sink->ob_pd->c_firstin)
    {
        if (!inno)
        {
            to = &sink->ob_pd;
            goto doit;
        }
        else inno--;
    }
    for (i = sink->ob_inlet; i && inno; i = i->i_next, inno--) ;
    if (!i) return (0);
    to = &i->i_pd;
doit:
    ochead = outlet_getconnectionpointer(o);
    oc = (t_outconnect *)t_getbytes(sizeof(*oc));
    oc->oc_next = 0;
    oc->oc_to = to;
        /* append it to the end of the list */
        /* LATER we might cache the last "oc" to make this faster. */
    if ((oc2 = *ochead))
    {
        while (oc2->oc_next)
            oc2 = oc2->oc_next;
        oc2->oc_next = oc;
    }
    else *ochead = oc;
    if (o->o_sym == &s_signal) canvas_update_dsp();

    return (oc);
}